

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_454b0e::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  TransformSelectorFor *this_local;
  
  TransformSelectorIndexes::~TransformSelectorIndexes(&this->super_TransformSelectorIndexes);
  return;
}

Assistant:

TransformSelectorFor(int start, int stop, int step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }